

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O3

EStatusCode __thiscall
ShadingWriter::WriteRGBATiledPatternObject
          (ShadingWriter *this,RadialShading *inRadialShading,PDFRectangle *inBounds,
          PDFMatrix *inMatrix,ObjectIDType inPatternObjectId)

{
  InterpretedGradientStopList *this_00;
  InterpretedGradientStopList *__x;
  _List_node_base *p_Var1;
  EStatusCode EVar2;
  ShadingWriter *this_01;
  ObjectIDType rgbShadingPatternObjectId;
  ObjectIDType alphaShadingPatternObjectId;
  RadialShading alphaRadialShading;
  ObjectIDType local_b0;
  ObjectIDType local_a8;
  _List_node_base local_a0;
  RadialShading local_88;
  
  EVar2 = WriteSoftmaskPatternObjectForRGBAShades
                    (this,inBounds,inMatrix,inPatternObjectId,&local_a8,&local_b0);
  if (EVar2 == eSuccess) {
    local_88.x0 = inRadialShading->x0;
    local_88.y0 = inRadialShading->y0;
    local_88.r0 = inRadialShading->r0;
    local_88.x1 = inRadialShading->x1;
    local_88.y1 = inRadialShading->y1;
    local_88.r1 = inRadialShading->r1;
    this_00 = &local_88.colorLine;
    __x = &inRadialShading->colorLine;
    this_01 = (ShadingWriter *)__x;
    std::__cxx11::list<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>::list
              (this_00,__x);
    local_88.gradientExtend = inRadialShading->gradientExtend;
    CreateAlphaShadingColorLine((InterpretedGradientStopList *)&local_a0,this_01,__x);
    std::__cxx11::list<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>::
    _M_move_assign(this_00,&local_a0);
    while (local_a0._M_next != &local_a0) {
      p_Var1 = (((_List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_> *)
                &(local_a0._M_next)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(local_a0._M_next,0x28);
      local_a0._M_next = p_Var1;
    }
    EVar2 = WriteRGBShadingPatternObject(this,&local_88,inBounds,inMatrix,local_a8);
    if (EVar2 == eSuccess) {
      EVar2 = WriteRGBShadingPatternObject(this,inRadialShading,inBounds,inMatrix,local_b0);
    }
    while (local_88.colorLine.
           super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>.
           _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)this_00) {
      p_Var1 = (local_88.colorLine.
                super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>.
                _M_impl._M_node.super__List_node_base._M_next)->_M_next;
      operator_delete(local_88.colorLine.
                      super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>
                      ._M_impl._M_node.super__List_node_base._M_next,0x28);
      local_88.colorLine.
      super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>._M_impl.
      _M_node.super__List_node_base._M_next = p_Var1;
    }
  }
  return EVar2;
}

Assistant:

PDFHummus::EStatusCode ShadingWriter::WriteRGBATiledPatternObject(
    const RadialShading& inRadialShading, 
    const PDFRectangle& inBounds,
    const PDFMatrix& inMatrix,
    ObjectIDType inPatternObjectId
) {
    EStatusCode status = eSuccess;
    ObjectIDType alphaShadingPatternObjectId;
    ObjectIDType rgbShadingPatternObjectId;

    do {
        status = WriteSoftmaskPatternObjectForRGBAShades(inBounds, inMatrix, inPatternObjectId, alphaShadingPatternObjectId, rgbShadingPatternObjectId);
        if(status != eSuccess)
            break;

        // now, draw the alpha shading, which has the same pysical properties of the rgb one, but colors are all the alpha
        // component transitioning as a gradient
        RadialShading alphaRadialShading = inRadialShading;
        alphaRadialShading.colorLine = CreateAlphaShadingColorLine(inRadialShading.colorLine);

        status = WriteRGBShadingPatternObject(alphaRadialShading, inBounds, inMatrix, alphaShadingPatternObjectId);
        if(status != eSuccess)
            break;

        status = WriteRGBShadingPatternObject(inRadialShading, inBounds, inMatrix, rgbShadingPatternObjectId);

    } while(false);


    return status;    

}